

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExternalFixupMembersImport_BadMember_Test::TestBody(ExternalFixupMembersImport_BadMember_Test *this)

{
  bool bVar1;
  Message *message;
  char *pcVar2;
  error_code *lhs;
  char *in_R9;
  error_code eVar3;
  AssertHelper local_1f0;
  Message local_1e8;
  error_code local_1e0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_;
  allocator local_161;
  string local_160;
  parser<pstore::exchange::import_ns::callbacks> local_140;
  parser<pstore::exchange::import_ns::callbacks> *local_98;
  parser<pstore::exchange::import_ns::callbacks> *parser;
  string_mapping imported_names;
  ExternalFixupMembersImport_BadMember_Test *this_local;
  
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)this;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)&parser);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"{ \"bad\":true }",&local_161);
  anon_unknown.dwarf_33b920::ExternalFixupMembersImport::parse
            (&local_140,&local_160,&(this->super_ExternalFixupMembersImport).db_,
             (string_mapping *)&parser);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_98 = &local_140;
  local_189 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error(local_98);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_188,&local_189,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    message = testing::Message::operator<<(&local_198,(char (*) [27])"Expected the parse to fail");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_188,(AssertionResult *)0x2ecd1e,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x268,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,message);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  lhs = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error(local_98);
  eVar3 = pstore::exchange::import_ns::make_error_code(unrecognized_xfixup_key);
  local_1e0._M_cat = eVar3._M_cat;
  local_1e0._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_1d0,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::unrecognized_xfixup_key)",lhs,
             &local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_140);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&parser);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, BadMember) {
    pstore::exchange::import_ns::string_mapping imported_names;
    auto const & parser = this->parse (R"({ "bad":true })", &db_, imported_names);
    EXPECT_TRUE (parser.has_error ()) << "Expected the parse to fail";
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::unrecognized_xfixup_key));
}